

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptRegExp::GetPropertyQuery
          (JavascriptRegExp *this,Var originalInstance,JavascriptString *propertyNameString,
          Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyId propertyId;
  PropertyQueryFlags PVar2;
  ScriptContext *this_00;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  ScriptContext *pSStack_40;
  BOOL result;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  JavascriptString *propertyNameString_local;
  Var originalInstance_local;
  JavascriptRegExp *this_local;
  
  pSStack_40 = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)originalInstance;
  originalInstance_local = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::FindPropertyRecord(this_00,(JavascriptString *)value_local,&local_50);
  if (local_50 != (PropertyRecord *)0x0) {
    propertyId = PropertyRecord::GetPropertyId(local_50);
    bVar1 = GetPropertyBuiltIns(this,propertyId,&info_local->m_instance,
                                (BOOL *)((long)&propertyRecord + 4));
    if (bVar1) {
      PVar2 = JavascriptConversion::BooleanToPropertyQueryFlags(propertyRecord._4_4_);
      return PVar2;
    }
  }
  PVar2 = DynamicObject::GetPropertyQuery
                    (&this->super_DynamicObject,propertyNameString_local,
                     (JavascriptString *)value_local,&info_local->m_instance,
                     (PropertyValueInfo *)requestContext_local,pSStack_40);
  return PVar2;
}

Assistant:

PropertyQueryFlags JavascriptRegExp::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL result;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && GetPropertyBuiltIns(propertyRecord->GetPropertyId(), value, &result))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(result);
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
    }